

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * url_encode(char *in)

{
  char *out;
  char *pcStack_28;
  int out_len;
  char *d;
  char *s;
  char *in_local;
  
  out._4_4_ = 0;
  for (d = in; *d != '\0'; d = d + 1) {
    if ((((*d < '!') || ('~' < *d)) || (*d == '%')) || (*d == '=')) {
      out._4_4_ = out._4_4_ + 3;
    }
    else {
      out._4_4_ = out._4_4_ + 1;
    }
  }
  in_local = (char *)malloc((long)(out._4_4_ + 1));
  pcStack_28 = in_local;
  d = in;
  if (in_local == (char *)0x0) {
    in_local = (char *)0x0;
  }
  else {
    for (; *d != '\0'; d = d + 1) {
      if (((*d < '!') || ('~' < *d)) || ((*d == '%' || (*d == '=')))) {
        *pcStack_28 = '%';
        pcStack_28[1] = "0123456789ABCDEF"[(int)((int)*d >> 4 & 0xf)];
        pcStack_28[2] = "0123456789ABCDEF"[(int)((int)*d & 0xf)];
        pcStack_28 = pcStack_28 + 3;
      }
      else {
        *pcStack_28 = *d;
        pcStack_28 = pcStack_28 + 1;
      }
    }
    *pcStack_28 = '\0';
  }
  return in_local;
}

Assistant:

static char *
url_encode(const char *in)
{
	const char *s;
	char *d;
	int out_len = 0;
	char *out;

	for (s = in; *s != '\0'; s++) {
		if (*s < 33 || *s > 126 || *s == '%' || *s == '=')
			out_len += 3;
		else
			out_len++;
	}

	out = (char *)malloc(out_len + 1);
	if (out == NULL)
		return (NULL);

	for (s = in, d = out; *s != '\0'; s++) {
		/* encode any non-printable ASCII character or '%' or '=' */
		if (*s < 33 || *s > 126 || *s == '%' || *s == '=') {
			/* URL encoding is '%' followed by two hex digits */
			*d++ = '%';
			*d++ = "0123456789ABCDEF"[0x0f & (*s >> 4)];
			*d++ = "0123456789ABCDEF"[0x0f & *s];
		} else {
			*d++ = *s;
		}
	}
	*d = '\0';
	return (out);
}